

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QAbstractTextDocumentLayout::Selection>::copyAppend
          (QGenericArrayOps<QAbstractTextDocumentLayout::Selection> *this,Selection *b,Selection *e)

{
  Selection *pSVar1;
  long lVar2;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).ptr;
    lVar2 = (this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).size;
    do {
      QTextCursor::QTextCursor(&pSVar1[lVar2].cursor,&b->cursor);
      QTextFormat::QTextFormat
                (&pSVar1[lVar2].format.super_QTextFormat,&(b->format).super_QTextFormat);
      lVar2 = (this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).size + 1;
      (this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).size = lVar2;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }